

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isBilinearRangeValid
               (LookupPrecision *prec,ColorQuad *quad,Vec2 *xBounds,Vec2 *yBounds,float searchStep,
               Vec4 *result)

{
  bool bVar1;
  bool bVar2;
  float fVar3;
  Vec4 maxVal;
  Vec4 minVal;
  tcu local_94 [4];
  tcu local_90 [4];
  tcu local_8c [4];
  tcu local_88 [16];
  tcu local_78 [16];
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  tcu local_50 [16];
  tcu local_40 [16];
  
  min(local_78,quad);
  operator-(local_40,(Vector<float,_4> *)local_78,&prec->colorThreshold);
  max(local_88,quad);
  operator+(local_78,(Vector<float,_4> *)local_88,&prec->colorThreshold);
  greaterThanEqual<float,4>(local_8c,result,(Vector<float,_4> *)local_40);
  lessThanEqual<float,4>(local_90,result,(Vector<float,_4> *)local_78);
  logicalAnd<bool,4>(local_50,(Vector<bool,_4> *)local_8c,(Vector<bool,_4> *)local_90);
  logicalNot<bool,4>(local_94,&prec->colorMask);
  logicalOr<bool,4>(local_88,(Vector<bool,_4> *)local_50,(Vector<bool,_4> *)local_94);
  bVar1 = boolAll<4>((Vector<bool,_4> *)local_88);
  if (bVar1) {
    local_68 = xBounds->m_data[0];
    uStack_64 = 0;
    uStack_60 = 0;
    uStack_5c = 0;
    while( true ) {
      fVar3 = xBounds->m_data[1];
      bVar1 = local_68 < fVar3 + searchStep;
      if (fVar3 + searchStep <= local_68) break;
      fVar3 = (float)(~-(uint)(local_68 <= fVar3) & (uint)fVar3 |
                     -(uint)(local_68 <= fVar3) & (uint)local_68);
      operator*(local_78,1.0 - fVar3,&quad->p00);
      operator*(local_88,fVar3,&quad->p10);
      operator+(local_40,(Vector<float,_4> *)local_78,(Vector<float,_4> *)local_88);
      operator*(local_88,1.0 - fVar3,&quad->p01);
      operator*(local_50,fVar3,&quad->p11);
      operator+(local_78,(Vector<float,_4> *)local_88,(Vector<float,_4> *)local_50);
      bVar2 = isLinearRangeValid(prec,(Vec4 *)local_40,(Vec4 *)local_78,yBounds,result);
      if (bVar2) {
        return bVar1;
      }
      local_68 = local_68 + searchStep;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool isBilinearRangeValid (const LookupPrecision&	prec,
								  const ColorQuad&			quad,
								  const Vec2&				xBounds,
								  const Vec2&				yBounds,
								  const float				searchStep,
								  const Vec4&				result)
{
	DE_ASSERT(xBounds.x() <= xBounds.y());
	DE_ASSERT(yBounds.x() <= yBounds.y());
	DE_ASSERT(xBounds.x() + searchStep > xBounds.x()); // step is not effectively 0
	DE_ASSERT(xBounds.y() + searchStep > xBounds.y());

	if (!isInColorBounds(prec, quad, result))
		return false;

	for (float x = xBounds.x(); x < xBounds.y()+searchStep; x += searchStep)
	{
		const float		a	= de::min(x, xBounds.y());
		const Vec4		c0	= quad.p00*(1.0f - a) + quad.p10*a;
		const Vec4		c1	= quad.p01*(1.0f - a) + quad.p11*a;

		if (isLinearRangeValid(prec, c0, c1, yBounds, result))
			return true;
	}

	return false;
}